

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O0

int dfsplain_e(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  Flow_Data_t *pFVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pNext;
  int i;
  Abc_Obj_t *pPred_local;
  Abc_Obj_t *pObj_local;
  
  pFVar1 = pManMR->pDataArray;
  uVar3 = Abc_ObjId(pObj);
  if (((*(ushort *)(pFVar1 + uVar3) & 0x90 & pManMR->constraintMask) == 0) &&
     (iVar4 = Abc_ObjIsPi(pObj), iVar4 == 0)) {
    pFVar1 = pManMR->pDataArray;
    uVar3 = Abc_ObjId(pObj);
    *(ushort *)(pFVar1 + uVar3) = *(ushort *)(pFVar1 + uVar3) | 1;
    if (pManMR->fIsForward == 0) {
      for (pNext._4_4_ = 0; iVar4 = Abc_ObjFaninNum(pObj), pNext._4_4_ < iVar4;
          pNext._4_4_ = pNext._4_4_ + 1) {
        pAVar5 = Abc_ObjFanin(pObj,pNext._4_4_);
        pFVar1 = pManMR->pDataArray;
        uVar3 = Abc_ObjId(pAVar5);
        if (((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x2) ==
             (undefined1  [24])0x0) && (iVar4 = dfsplain_r(pAVar5,pPred), iVar4 != 0)) {
          return 1;
        }
      }
    }
    else {
      for (pNext._4_4_ = 0; iVar4 = Abc_ObjFanoutNum(pObj), pNext._4_4_ < iVar4;
          pNext._4_4_ = pNext._4_4_ + 1) {
        pAVar5 = Abc_ObjFanout(pObj,pNext._4_4_);
        pFVar1 = pManMR->pDataArray;
        uVar3 = Abc_ObjId(pAVar5);
        if (((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x2) ==
             (undefined1  [24])0x0) && (iVar4 = dfsplain_r(pAVar5,pPred), iVar4 != 0)) {
          return 1;
        }
      }
    }
    iVar4 = Abc_ObjIsLatch(pObj);
    if (iVar4 == 0) {
      if (pManMR->fIsForward == 0) {
        for (pNext._4_4_ = 0; iVar4 = Abc_ObjFanoutNum(pObj), pNext._4_4_ < iVar4;
            pNext._4_4_ = pNext._4_4_ + 1) {
          pAVar5 = Abc_ObjFanout(pObj,pNext._4_4_);
          pFVar1 = pManMR->pDataArray;
          uVar3 = Abc_ObjId(pAVar5);
          if (((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x1) ==
               (undefined1  [24])0x0) && (iVar4 = dfsplain_e(pAVar5,pPred), iVar4 != 0)) {
            return 1;
          }
        }
        if (pManMR->maxDelay != 0) {
          pNext._4_4_ = 0;
          while( true ) {
            pVVar2 = pManMR->vTimeEdges;
            uVar3 = Abc_ObjId(pObj);
            iVar4 = Vec_PtrSize(pVVar2 + uVar3);
            if (iVar4 <= pNext._4_4_) break;
            pVVar2 = pManMR->vTimeEdges;
            uVar3 = Abc_ObjId(pObj);
            pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2 + uVar3,pNext._4_4_);
            pFVar1 = pManMR->pDataArray;
            uVar3 = Abc_ObjId(pAVar5);
            if (((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x1) ==
                 (undefined1  [24])0x0) && (iVar4 = dfsplain_e(pAVar5,pPred), iVar4 != 0)) {
              return 1;
            }
            pNext._4_4_ = pNext._4_4_ + 1;
          }
        }
      }
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pObj);
      if (((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x4) !=
           (undefined1  [24])0x0) &&
         (pFVar1 = pManMR->pDataArray, uVar3 = Abc_ObjId(pObj),
         (undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x2) ==
         (undefined1  [24])0x0)) {
        pAVar5 = FGETPRED(pObj);
        iVar4 = dfsplain_r(pObj,pAVar5);
        if (iVar4 != 0) {
          pFVar1 = pManMR->pDataArray;
          uVar3 = Abc_ObjId(pObj);
          *(ushort *)(pFVar1 + uVar3) = *(ushort *)(pFVar1 + uVar3) & 0xfffb;
          FSETPRED(pObj,(Abc_Obj_t *)0x0);
          return 1;
        }
      }
      pObj_local._4_4_ = 0;
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  else {
    if (pPred == (Abc_Obj_t *)0x0) {
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretFlow.c"
                    ,0x216,"int dfsplain_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
    if (pManMR->fIsForward != 0) {
      __assert_fail("!pManMR->fIsForward",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretFlow.c"
                    ,0x217,"int dfsplain_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

int dfsplain_e( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext;
  
  if (FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask || 
      Abc_ObjIsPi(pObj)) {
    assert(pPred);
    assert(!pManMR->fIsForward);
    return 1;
  }

  FSET(pObj, VISITED_E);
  
  // printf(" %de\n", Abc_ObjId(pObj));
  
  // 1. structural edges
  if (pManMR->fIsForward)
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  else
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  
  if (Abc_ObjIsLatch(pObj))
    return 0;

  // 2. reverse edges (backward retiming only)
  if (!pManMR->fIsForward) {
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_E) &&
          dfsplain_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }

  // 3. timing edges (backward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_E) &&
            dfsplain_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  // unwind
  if (FTEST(pObj, FLOW) && 
      !FTEST(pObj, VISITED_R) &&
      dfsplain_r(pObj, FGETPRED(pObj))) {
    FUNSET(pObj, FLOW);
    FSETPRED(pObj, NULL);
#ifdef DEBUG_PRINT_FLOWS
    printf("u");
#endif
    goto found;
  }
  
  return 0;
  
 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif

  return 1;
}